

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int jx9Builtin_str_replace(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pjVar1;
  sxu32 sVar2;
  void *pChunk;
  sxi32 sVar3;
  int iVar4;
  ulong uVar5;
  char *pData;
  undefined8 *puVar6;
  char **ppcVar7;
  code *pcVar8;
  char **ppcVar9;
  int iVar10;
  uint uVar11;
  bool bVar12;
  sxu32 nOfft;
  int nByte;
  SySet sReplace;
  SyBlob sWorker;
  SyString sTemp;
  str_replace_data sRep;
  int local_e8;
  sxu32 local_e4;
  SySet local_e0;
  SySet local_b8;
  uint local_8c;
  SyBlob local_88;
  char *local_68;
  sxu32 local_60;
  jx9_context *local_58;
  undefined1 local_50 [4];
  undefined4 auStack_4c [3];
  SySet *local_40;
  jx9_context *local_38;
  
  if (nArg < 3) {
    jx9MemObjRelease(pCtx->pRet);
  }
  else {
    local_e0.pAllocator = &pCtx->pVm->sAllocator;
    local_e0.nUsed = 0;
    local_e0.nSize = 0;
    local_e0.eSize = 0x10;
    local_e0.nCursor = 0;
    local_e0.pBase = (void *)0x0;
    local_e0.pUserData = (void *)0x0;
    local_b8.nSize = 0;
    local_b8.nUsed = 0;
    local_b8.eSize = 0x10;
    local_b8.nCursor = 0;
    local_b8.pBase = (void *)0x0;
    local_b8.pUserData = (void *)0x0;
    local_88.pBlob = (char *)0x0;
    local_88.nByte = 0;
    local_88.mByte = 0;
    local_88.nFlags = 0;
    uVar5 = 0xfffffffffffffffc;
    do {
      *(undefined4 *)((long)auStack_4c + uVar5) = 0;
      uVar5 = uVar5 + 4;
    } while (uVar5 < 0x1c);
    local_40 = &local_e0;
    local_b8.pAllocator = local_e0.pAllocator;
    local_88.pAllocator = local_e0.pAllocator;
    local_38 = pCtx;
    pData = jx9_value_to_string(apArg[2],(int *)&local_e4);
    if ((int)local_e4 < 1) {
      jx9_value_string(pCtx->pRet,"",0);
    }
    else {
      SyBlobAppend(&local_88,pData,local_e4);
      pjVar1 = *apArg;
      if ((pjVar1->iFlags & 0x40) == 0) {
        local_68 = jx9_value_to_string(pjVar1,(int *)&local_e4);
        if ((int)local_e4 < 1) {
          jx9_result_value(pCtx,apArg[2]);
          return 0;
        }
        local_60 = local_e4;
        SySetPut(&local_e0,&local_68);
      }
      else {
        jx9HashmapWalk((jx9_hashmap *)(pjVar1->x).pOther,StrReplaceWalker,local_50);
      }
      pjVar1 = apArg[1];
      local_8c = pjVar1->iFlags;
      if ((local_8c & 0x40) == 0) {
        local_68 = jx9_value_to_string(pjVar1,(int *)&local_e4);
        local_60 = local_e4;
        SySetPut(&local_b8,&local_68);
      }
      else {
        local_40 = &local_b8;
        jx9HashmapWalk((jx9_hashmap *)(pjVar1->x).pOther,StrReplaceWalker,local_50);
      }
      local_e0._24_8_ = local_e0._24_8_ & 0xffffffff;
      local_b8._24_8_ = local_b8._24_8_ & 0xffffffff;
      local_68 = "";
      local_60 = 0;
      local_58 = pCtx;
      sVar3 = SyStrncmp((pCtx->pFunc->sName).zString,"str_ireplace",0xc);
      pcVar8 = SyBlobSearch;
      if (sVar3 == 0) {
        pcVar8 = iPatternMatch;
      }
      sVar2 = local_e0.nCursor;
      bVar12 = local_e0.nUsed <= local_e0.nCursor;
      local_e0.nCursor = local_e0.nCursor + 1;
      if (bVar12) {
        local_e0.nCursor = 0;
      }
      if (!bVar12) {
        puVar6 = (undefined8 *)((long)local_e0.pBase + (ulong)(local_e0.eSize * sVar2));
        do {
          if (*(int *)(puVar6 + 1) != 0) {
            if ((local_8c & 0x40) == 0) {
              ppcVar7 = (char **)0x0;
              if (local_b8.nUsed != 0) {
                ppcVar7 = (char **)((ulong)(local_b8.eSize * (local_b8.nUsed - 1)) +
                                   (long)local_b8.pBase);
              }
            }
            else {
              uVar11 = local_b8.eSize * local_b8.nCursor;
              iVar4 = local_b8.nCursor + 1;
              bVar12 = local_b8.nUsed <= local_b8.nCursor;
              if (bVar12) {
                iVar4 = 0;
              }
              local_b8.nCursor = iVar4;
              ppcVar7 = (char **)((ulong)uVar11 + (long)local_b8.pBase);
              if (bVar12) {
                ppcVar7 = (char **)0x0;
              }
            }
            ppcVar9 = ppcVar7;
            if (ppcVar7 == (char **)0x0) {
              ppcVar9 = &local_68;
            }
            local_e8 = 0;
            if (local_88.nByte != 0) {
              if (ppcVar7 == (char **)0x0) {
                ppcVar7 = &local_68;
              }
              uVar5 = 0;
              do {
                iVar10 = (int)uVar5;
                iVar4 = (*pcVar8)((char *)((long)local_88.pBlob + uVar5),local_88.nByte - iVar10,
                                  *puVar6,*(undefined4 *)(puVar6 + 1),&local_e8);
                if (iVar4 != 0) break;
                StringReplace(&local_88,local_e8 + iVar10,*(int *)(puVar6 + 1),*ppcVar9,
                              *(int *)(ppcVar7 + 1));
                uVar11 = iVar10 + local_e8 + *(int *)(ppcVar7 + 1);
                uVar5 = (ulong)uVar11;
              } while (uVar11 < local_88.nByte);
            }
          }
          bVar12 = local_e0.nCursor < local_e0.nUsed;
          if (bVar12) {
            puVar6 = (undefined8 *)
                     ((ulong)(local_e0.eSize * local_e0.nCursor) + (long)local_e0.pBase);
          }
          local_e0.nCursor = local_e0.nCursor + 1;
          if (!bVar12) {
            local_e0.nCursor = 0;
          }
        } while (bVar12);
      }
      pChunk = local_88.pBlob;
      jx9_value_string(local_58->pRet,(char *)local_88.pBlob,local_88.nByte);
      if (((jx9_vm *)local_e0.pAllocator != (jx9_vm *)0x0) && (local_e0.pBase != (void *)0x0)) {
        SyMemBackendFree(local_e0.pAllocator,local_e0.pBase);
      }
      local_e0.pBase = (void *)0x0;
      local_e0._16_8_ = local_e0._16_8_ & 0xffffffff00000000;
      local_e0._24_8_ = local_e0._24_8_ & 0xffffffff;
      if (((jx9_vm *)local_b8.pAllocator != (jx9_vm *)0x0) && (local_b8.pBase != (void *)0x0)) {
        SyMemBackendFree(local_b8.pAllocator,local_b8.pBase);
      }
      local_b8.pBase = (void *)0x0;
      local_b8.nUsed = 0;
      local_b8._24_8_ = local_b8._24_8_ & 0xffffffff;
      if (((local_88.nFlags & 6) == 0) && (local_88.mByte != 0)) {
        SyMemBackendFree(local_88.pAllocator,pChunk);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_str_replace(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	SyString sTemp, *pSearch, *pReplace;
	ProcStringMatch xMatch;
	const char *zIn, *zFunc;
	str_replace_data sRep;
	SyBlob sWorker;
	SySet sReplace;
	SySet sSearch;
	int rep_str;
	int nByte;
	sxi32 rc;
	if( nArg < 3 ){
		/* Missing/Invalid arguments, return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Initialize fields */
	SySetInit(&sSearch, &pCtx->pVm->sAllocator, sizeof(SyString));
	SySetInit(&sReplace, &pCtx->pVm->sAllocator, sizeof(SyString));
	SyBlobInit(&sWorker, &pCtx->pVm->sAllocator);
	SyZero(&sRep, sizeof(str_replace_data));
	sRep.pCtx = pCtx;
	sRep.pCollector = &sSearch;
	rep_str = 0;
	/* Extract the subject */
	zIn = jx9_value_to_string(apArg[2], &nByte);
	if( nByte < 1 ){
		/* Nothing to replace, return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Copy the subject */
	SyBlobAppend(&sWorker, (const void *)zIn, (sxu32)nByte);
	/* Search string */
	if( jx9_value_is_json_array(apArg[0]) ){
		/* Collect search string */
		jx9_array_walk(apArg[0], StrReplaceWalker, &sRep);
	}else{
		/* Single pattern */
		zIn = jx9_value_to_string(apArg[0], &nByte);
		if( nByte < 1 ){
			/* Return the subject untouched since no search string is available */
			jx9_result_value(pCtx, apArg[2]/* Subject as thrird argument*/);
			return JX9_OK;
		}
		SyStringInitFromBuf(&sTemp, zIn, nByte);
		/* Save for later processing */
		SySetPut(&sSearch, (const void *)&sTemp);
	}
	/* Replace string */
	if( jx9_value_is_json_array(apArg[1]) ){
		/* Collect replace string */
		sRep.pCollector = &sReplace;
		jx9_array_walk(apArg[1], StrReplaceWalker, &sRep);
	}else{
		/* Single needle */
		zIn = jx9_value_to_string(apArg[1], &nByte);
		rep_str = 1;
		SyStringInitFromBuf(&sTemp, zIn, nByte);
		/* Save for later processing */
		SySetPut(&sReplace, (const void *)&sTemp);
	}
	/* Reset loop cursors */
	SySetResetCursor(&sSearch);
	SySetResetCursor(&sReplace);
	pReplace = pSearch = 0; /* cc warning */
	SyStringInitFromBuf(&sTemp, "", 0);
	/* Extract function name */
	zFunc = jx9_function_name(pCtx);
	/* Set the default pattern match routine */
	xMatch = SyBlobSearch;
	if( SyStrncmp(zFunc, "str_ireplace", sizeof("str_ireplace") - 1) ==  0 ){
		/* Case insensitive pattern match */
		xMatch = iPatternMatch;
	}
	/* Start the replace process */
	while( SXRET_OK == SySetGetNextEntry(&sSearch, (void **)&pSearch) ){
		sxu32 nCount, nOfft;
		if( pSearch->nByte <  1 ){
			/* Empty string, ignore */
			continue;
		}
		/* Extract the replace string */
		if( rep_str ){
			pReplace = (SyString *)SySetPeek(&sReplace);
		}else{
			if( SXRET_OK != SySetGetNextEntry(&sReplace, (void **)&pReplace) ){
				/* Sepecial case when 'replace set' has fewer values than the search set.
				 * An empty string is used for the rest of replacement values
				 */
				pReplace = 0;
			}
		}
		if( pReplace == 0 ){
			/* Use an empty string instead */
			pReplace = &sTemp;
		}
		nOfft = nCount = 0;
		for(;;){
			if( nCount >= SyBlobLength(&sWorker) ){
				break;
			}
			/* Perform a pattern lookup */
			rc = xMatch(SyBlobDataAt(&sWorker, nCount), SyBlobLength(&sWorker) - nCount, (const void *)pSearch->zString, 
				pSearch->nByte, &nOfft);
			if( rc != SXRET_OK ){
				/* Pattern not found */
				break;
			}
			/* Perform the replace operation */
			StringReplace(&sWorker, nCount+nOfft, (int)pSearch->nByte, pReplace->zString, (int)pReplace->nByte);
			/* Increment offset counter */
			nCount += nOfft + pReplace->nByte;
		}
	}
	/* All done, clean-up the mess left behind */
	jx9_result_string(pCtx, (const char *)SyBlobData(&sWorker), (int)SyBlobLength(&sWorker));
	SySetRelease(&sSearch);
	SySetRelease(&sReplace);
	SyBlobRelease(&sWorker);
	return JX9_OK;
}